

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

upb_DecodeStatus
upb_DecodeLengthPrefixed
          (char *buf,size_t size,upb_Message *msg,size_t *num_bytes_read,upb_MiniTable *mt,
          upb_ExtensionRegistry *extreg,int options,upb_Arena *arena)

{
  long lVar1;
  upb_DecodeStatus uVar2;
  byte bVar3;
  ulong size_00;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (size != 0) {
    uVar6 = 9;
    if (size - 1 < 9) {
      uVar6 = size - 1;
    }
    lVar5 = -1;
    bVar3 = 0;
    lVar4 = 0;
    size_00 = 0;
    do {
      size_00 = ((ulong)((byte)buf[lVar4] & 0x7f) << (bVar3 & 0x3f)) + size_00;
      if (-1 < buf[lVar4]) {
        *num_bytes_read = size_00 - lVar5;
        if (0x7fffffff < size_00 || size < size_00 - lVar5) {
          return kUpb_DecodeStatus_Malformed;
        }
        uVar2 = upb_Decode(buf + -lVar5,size_00,msg,mt,extreg,options,arena);
        return uVar2;
      }
      lVar1 = uVar6 + lVar5;
      lVar5 = lVar5 + -1;
      bVar3 = bVar3 + 7;
      lVar4 = lVar4 + 1;
    } while (lVar1 != -1);
  }
  return kUpb_DecodeStatus_Malformed;
}

Assistant:

upb_DecodeStatus upb_DecodeLengthPrefixed(const char* buf, size_t size,
                                          upb_Message* msg,
                                          size_t* num_bytes_read,
                                          const upb_MiniTable* mt,
                                          const upb_ExtensionRegistry* extreg,
                                          int options, upb_Arena* arena) {
  // To avoid needing to make a Decoder just to decode the initial length,
  // hand-decode the leading varint for the message length here.
  uint64_t msg_len = 0;
  for (size_t i = 0;; ++i) {
    if (i >= size || i > 9) {
      return kUpb_DecodeStatus_Malformed;
    }
    uint64_t b = *buf;
    buf++;
    msg_len += (b & 0x7f) << (i * 7);
    if ((b & 0x80) == 0) {
      *num_bytes_read = i + 1 + msg_len;
      break;
    }
  }

  // If the total number of bytes we would read (= the bytes from the varint
  // plus however many bytes that varint says we should read) is larger then the
  // input buffer then error as malformed.
  if (*num_bytes_read > size) {
    return kUpb_DecodeStatus_Malformed;
  }
  if (msg_len > INT32_MAX) {
    return kUpb_DecodeStatus_Malformed;
  }

  return upb_Decode(buf, msg_len, msg, mt, extreg, options, arena);
}